

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O0

QStringList * xdgConfigDirs(void)

{
  bool bVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *dirs;
  QString xdgConfigDirs;
  rvalue_ref in_stack_ffffffffffffff68;
  QList<QString> *in_stack_ffffffffffffff70;
  QStringList *size;
  char16_t *str;
  QString *in_stack_ffffffffffffffa8;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  size = in_RDI;
  qEnvironmentVariable((char *)&local_28);
  (in_RDI->d).size = (qsizetype)str;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  dirsList(in_stack_ffffffffffffffa8);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x7de236);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s(str,(size_t)size);
    QList<QString>::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QString::~QString((QString *)0x7de272);
  }
  QString::~QString((QString *)0x7de2d0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return size;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList xdgConfigDirs()
{
    // http://standards.freedesktop.org/basedir-spec/latest/
    const QString xdgConfigDirs = qEnvironmentVariable("XDG_CONFIG_DIRS");

    QStringList dirs = dirsList(xdgConfigDirs);
    if (dirs.isEmpty())
        dirs.push_back(u"/etc/xdg"_s);

    return dirs;
}